

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

bool __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
::serialize<google::sparsehash_internal::pod_serializer<std::__cxx11::string>,StringIO>
          (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
           *this,StringIO *param_2)

{
  bool bVar1;
  ulong in_RAX;
  int bit_1;
  long lVar2;
  int bit;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uchar bits;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    *)this);
  bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>(param_2,0x13578642,4);
  if (((bVar1) &&
      (bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                         (param_2,*(unsigned_long *)(this + 0x90),8), bVar1)) &&
     (bVar1 = sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
                        (param_2,*(unsigned_long *)(this + 0x88),8), bVar1)) {
    if (*(long *)(this + 0x90) == 0) {
      return true;
    }
    lVar4 = 0;
    uVar5 = 0;
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      lVar3 = 0;
      do {
        if ((uVar5 + lVar3 < *(ulong *)(this + 0x90)) &&
           (bVar1 = dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                    ::test_empty((dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                                  *)this,uVar5 + lVar3), !bVar1)) {
          uStack_38 = CONCAT17(uStack_38._7_1_ | (byte)(1 << ((byte)lVar3 & 0x1f)),
                               (undefined7)uStack_38);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      std::__cxx11::string::append((char *)param_2->s_,(long)&uStack_38 + 7);
      lVar2 = 0;
      lVar3 = lVar4;
      do {
        if ((uStack_38._7_1_ >> ((uint)lVar2 & 0x1f) & 1) != 0) {
          std::__cxx11::string::append((char *)param_2->s_,*(long *)(this + 0xa8) + lVar3);
        }
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x20;
      } while (lVar2 != 8);
      uVar5 = uVar5 + 8;
      lVar4 = lVar4 + 0x100;
    } while (uVar5 < *(ulong *)(this + 0x90));
    return true;
  }
  return false;
}

Assistant:

bool serialize(ValueSerializer serializer, OUTPUT* fp) {
    squash_deleted();  // so we don't have to worry about delkey
    if (!sparsehash_internal::write_bigendian_number(fp, MAGIC_NUMBER, 4))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_buckets, 8))
      return false;
    if (!sparsehash_internal::write_bigendian_number(fp, num_elements, 8))
      return false;
    // Now write a bitmap of non-empty buckets.
    for (size_type i = 0; i < num_buckets; i += 8) {
      unsigned char bits = 0;
      for (int bit = 0; bit < 8; ++bit) {
        if (i + bit < num_buckets && !test_empty(i + bit)) bits |= (1 << bit);
      }
      if (!sparsehash_internal::write_data(fp, &bits, sizeof(bits)))
        return false;
      for (int bit = 0; bit < 8; ++bit) {
        if (bits & (1 << bit)) {
          if (!serializer(fp, table[i + bit])) return false;
        }
      }
    }
    return true;
  }